

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::ExtensionSet(ExtensionSet *this,Arena *arena)

{
  this->arena_ = arena;
  this->flat_capacity_ = 0;
  this->flat_size_ = 0;
  (this->map_).flat = (KeyValue *)0x0;
  return;
}

Assistant:

ExtensionSet::ExtensionSet(Arena* arena)
    : arena_(arena),
      flat_capacity_(0),
      flat_size_(0),
      map_{flat_capacity_ == 0
               ? NULL
               : Arena::CreateArray<KeyValue>(arena_, flat_capacity_)} {}